

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManCountPisWithFanout(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_20;
  int local_1c;
  int Count;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar3 = false;
    if (local_1c < iVar1) {
      _Count = Gia_ManCi(p,local_1c);
      bVar3 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)_Count = *(ulong *)_Count & 0xffffffffbfffffff;
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    bVar3 = false;
    if (local_1c < p->nObjs) {
      _Count = Gia_ManObj(p,local_1c);
      bVar3 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(_Count);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin0(_Count);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      pGVar2 = Gia_ObjFanin1(_Count);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
    }
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar3 = false;
    if (local_1c < iVar1) {
      _Count = Gia_ManCo(p,local_1c);
      bVar3 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGVar2 = Gia_ObjFanin0(_Count);
    *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar3 = false;
    if (local_1c < iVar1) {
      _Count = Gia_ManCi(p,local_1c);
      bVar3 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    local_20 = ((uint)(*(ulong *)_Count >> 0x1e) & 1) + local_20;
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    bVar3 = false;
    if (local_1c < p->nObjs) {
      _Count = Gia_ManObj(p,local_1c);
      bVar3 = _Count != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)_Count = *(ulong *)_Count & 0xffffffffbfffffff;
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Gia_ManCountPisWithFanout( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int i, Count = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_ObjFanin0(pObj)->fMark0 = 1;
        Gia_ObjFanin1(pObj)->fMark0 = 1;
    }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    Gia_ManForEachCi( p, pObj, i )
        Count += pObj->fMark0;
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    return Count;
}